

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmVariableWatch.cxx
# Opt level: O2

bool __thiscall
cmVariableWatch::AddWatch
          (cmVariableWatch *this,string *variable,WatchMethod method,void *client_data,
          DeleteData delete_data)

{
  long *plVar1;
  Pair *pPVar2;
  vector<cmVariableWatch::Pair*,std::allocator<cmVariableWatch::Pair*>> *this_00;
  ulong uVar3;
  ulong uVar4;
  Pair *x;
  auto_ptr<cmVariableWatch::Pair> p;
  Pair *local_38;
  
  pPVar2 = (Pair *)operator_new(0x18);
  pPVar2->Method = method;
  pPVar2->ClientData = client_data;
  pPVar2->DeleteDataCall = delete_data;
  p.x_ = pPVar2;
  this_00 = (vector<cmVariableWatch::Pair*,std::allocator<cmVariableWatch::Pair*>> *)
            std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmVariableWatch::Pair_*,_std::allocator<cmVariableWatch::Pair_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmVariableWatch::Pair_*,_std::allocator<cmVariableWatch::Pair_*>_>_>_>_>
            ::operator[](&this->WatchMap,variable);
  uVar3 = *(long *)(this_00 + 8) - *(long *)this_00 >> 3;
  for (uVar4 = 0; uVar3 != uVar4; uVar4 = uVar4 + 1) {
    if (((client_data != (void *)0x0) &&
        (plVar1 = *(long **)(*(long *)this_00 + uVar4 * 8), (WatchMethod)*plVar1 == method)) &&
       ((void *)plVar1[1] == client_data)) goto LAB_003a97e0;
  }
  p.x_ = (Pair *)0x0;
  local_38 = pPVar2;
  std::vector<cmVariableWatch::Pair*,std::allocator<cmVariableWatch::Pair*>>::
  emplace_back<cmVariableWatch::Pair*>(this_00,&local_38);
LAB_003a97e0:
  ::cm::auto_ptr<cmVariableWatch::Pair>::~auto_ptr(&p);
  return uVar3 <= uVar4;
}

Assistant:

bool cmVariableWatch::AddWatch(const std::string& variable, WatchMethod method,
                               void* client_data /*=0*/,
                               DeleteData delete_data /*=0*/)
{
  CM_AUTO_PTR<cmVariableWatch::Pair> p(new cmVariableWatch::Pair);
  p->Method = method;
  p->ClientData = client_data;
  p->DeleteDataCall = delete_data;
  cmVariableWatch::VectorOfPairs* vp = &this->WatchMap[variable];
  cmVariableWatch::VectorOfPairs::size_type cc;
  for (cc = 0; cc < vp->size(); cc++) {
    cmVariableWatch::Pair* pair = (*vp)[cc];
    if (pair->Method == method && client_data &&
        client_data == pair->ClientData) {
      // Callback already exists
      return false;
    }
  }
  vp->push_back(p.release());
  return true;
}